

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TArray<FKeySection,_FKeySection>::DoDelete
          (TArray<FKeySection,_FKeySection> *this,uint first,uint last)

{
  FKeySection *pFVar1;
  int iVar2;
  long lVar3;
  
  if (last != 0xffffffff) {
    if (first <= last) {
      lVar3 = (ulong)first << 5;
      iVar2 = (last - first) + 1;
      do {
        pFVar1 = this->Array;
        TArray<FKeyAction,_FKeyAction>::~TArray
                  ((TArray<FKeyAction,_FKeyAction> *)((long)&(pFVar1->mActions).Array + lVar3));
        FString::~FString((FString *)((long)&(pFVar1->mSection).Chars + lVar3));
        FString::~FString((FString *)((long)&(pFVar1->mTitle).Chars + lVar3));
        lVar3 = lVar3 + 0x20;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    return;
  }
  __assert_fail("last != ~0u",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./tarray.h"
                ,0x1b2,
                "void TArray<FKeySection>::DoDelete(unsigned int, unsigned int) [T = FKeySection, TT = FKeySection]"
               );
}

Assistant:

void DoDelete (unsigned int first, unsigned int last)
	{
		assert (last != ~0u);
		for (unsigned int i = first; i <= last; ++i)
		{
			Array[i].~T();
		}
	}